

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O2

void Aig_TableDelete(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *paVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTable.c"
                  ,199,"void Aig_TableDelete(Aig_Man_t *, Aig_Obj_t *)");
  }
  paVar1 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)Aig_TableFind(p,pObj);
  if (paVar1->pNext == pObj) {
    *paVar1 = pObj->field_0;
    (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
    return;
  }
  __assert_fail("*ppPlace == pObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTable.c"
                ,0xc9,"void Aig_TableDelete(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_TableDelete( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t ** ppPlace;
    assert( !Aig_IsComplement(pObj) );
    ppPlace = Aig_TableFind( p, pObj );
    assert( *ppPlace == pObj ); // node should be in the table
    // remove the node
    *ppPlace = pObj->pNext;
    pObj->pNext = NULL;
}